

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O1

int __thiscall arbiter::http::Curl::perform(Curl *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  long httpCode;
  undefined8 local_20;
  
  local_20 = 0;
  iVar1 = curl_easy_perform(this->m_curl);
  curl_easy_getinfo(this->m_curl,0x200002,&local_20);
  curl_easy_reset(this->m_curl);
  if (iVar1 != 0) {
    if (this->m_verbose == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&::std::cout,"Curl failure: ",0xe);
      __s = (char *)curl_easy_strerror(iVar1);
      if (__s == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(::std::cout + -0x18) + 0x19a348);
      }
      else {
        sVar2 = strlen(__s);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,__s,sVar2);
      }
      ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + 'H');
      ::std::ostream::put('H');
      ::std::ostream::flush();
    }
    local_20 = 0x226;
  }
  return (int)local_20;
}

Assistant:

int Curl::perform()
{
#ifdef ARBITER_CURL
    long httpCode(0);

    const auto code(curl_easy_perform(m_curl));
    curl_easy_getinfo(m_curl, CURLINFO_RESPONSE_CODE, &httpCode);
    curl_easy_reset(m_curl);

    if (code != CURLE_OK)
    {
        if (m_verbose)
        {
            std::cout << "Curl failure: " << curl_easy_strerror(code) << 
                std::endl;
        }
        httpCode = 550;
    }

    return httpCode;
#else
    throw ArbiterError(fail);
#endif
}